

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void wasm::writeBase64VLQ(ostream *out,int32_t n)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char local_2a;
  char local_29;
  
  uVar2 = n * -2 + 1;
  if (-1 < n) {
    uVar2 = n * 2;
  }
  do {
    uVar3 = uVar2 & 0x1f;
    if (uVar2 < 0x20) {
      pcVar4 = &local_29;
      local_29 = (char)uVar2 + 'A';
      if (0x19 < uVar3) {
        local_29 = (char)uVar2 + 'G';
      }
    }
    else {
      pcVar4 = &local_2a;
      if (uVar3 < 0x14) {
        local_2a = (char)uVar3 + 'g';
      }
      else if (uVar3 < 0x1e) {
        local_2a = (char)uVar3 + '\x1c';
      }
      else {
        local_2a = (uVar3 != 0x1e) * '\x04' + '+';
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,1);
    bVar1 = 0x1f < uVar2;
    uVar2 = uVar2 >> 5;
  } while (bVar1);
  return;
}

Assistant:

static void writeBase64VLQ(std::ostream& out, int32_t n) {
  uint32_t value = n >= 0 ? n << 1 : ((-n) << 1) | 1;
  while (1) {
    uint32_t digit = value & 0x1F;
    value >>= 5;
    if (!value) {
      // last VLQ digit -- base64 codes 'A'..'Z', 'a'..'f'
      out << char(digit < 26 ? 'A' + digit : 'a' + digit - 26);
      break;
    }
    // more VLG digit will follow -- add continuation bit (0x20),
    // base64 codes 'g'..'z', '0'..'9', '+', '/'
    out << char(digit < 20
                  ? 'g' + digit
                  : digit < 30 ? '0' + digit - 20 : digit == 30 ? '+' : '/');
  }
}